

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bswap.h
# Opt level: O0

int lduw_he_p(void *ptr)

{
  uint16_t r;
  void *ptr_local;
  
  return (int)*ptr;
}

Assistant:

static inline int lduw_he_p(const void *ptr)
{
    uint16_t r;
#ifdef _MSC_VER
    memcpy(&r, ptr, sizeof(r));
#else
    __builtin_memcpy(&r, ptr, sizeof(r));
#endif
    return r;
}